

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O1

void h265e_slice_set_ref_poc_list(H265eSlice *slice)

{
  H265eDpbFrm *(*papHVar1) [17];
  RK_S32 (*paRVar2) [17];
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_slice_set_ref_poc_list");
  }
  papHVar1 = slice->m_refPicList;
  paRVar2 = slice->m_refPOCList;
  lVar3 = 0;
  do {
    if (0 < slice->m_numRefIdx[lVar3]) {
      lVar4 = 0;
      do {
        (*paRVar2)[lVar4] = (*papHVar1)[lVar4]->poc;
        lVar4 = lVar4 + 1;
      } while (lVar4 < slice->m_numRefIdx[lVar3]);
    }
    papHVar1 = papHVar1 + 1;
    paRVar2 = paRVar2 + 1;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_slice","leave\n","h265e_slice_set_ref_poc_list");
  return;
}

Assistant:

void h265e_slice_set_ref_poc_list(H265eSlice *slice)
{
    RK_S32 dir, numRefIdx;

    h265e_dbg_func("enter\n");

    for (dir = 0; dir < 2; dir++) {
        for (numRefIdx = 0; numRefIdx < slice->m_numRefIdx[dir]; numRefIdx++) {
            slice->m_refPOCList[dir][numRefIdx] = slice->m_refPicList[dir][numRefIdx]->poc;
        }
    }

    h265e_dbg_func("leave\n");
}